

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abs.h
# Opt level: O0

void __thiscall
mp::
AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::ConvertCtxNeg(AbsConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,ItemType_conflict1 *ac,int param_3)

{
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<double> __l_01;
  initializer_list<int> __l_02;
  const_reference pvVar1;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *pFVar2;
  FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  FunctionalConstraint *in_RSI;
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RDI;
  NodeRange NVar3;
  int res;
  int arg;
  size_type in_stack_fffffffffffffc28;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *in_stack_fffffffffffffc30;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  undefined1 uVar4;
  LinTerms *in_stack_fffffffffffffc50;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *in_stack_fffffffffffffc58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc60;
  AlgConRhs<1> rr;
  AlgConRhs<1> in_stack_fffffffffffffc90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  int iVar5;
  undefined4 in_stack_fffffffffffffca4;
  value_type vVar6;
  undefined1 local_329;
  undefined8 local_328;
  undefined8 local_320;
  undefined8 *local_318;
  undefined8 local_310;
  NodeRange local_1d8;
  AlgConRhs<1> local_1c8;
  undefined1 local_1b9 [73];
  undefined8 local_170;
  undefined8 local_168;
  undefined8 *local_160;
  undefined8 local_158;
  int local_1c;
  value_type local_18;
  FunctionalConstraint *local_10;
  
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffc48 >> 0x38);
  local_10 = in_RSI;
  CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>::GetArguments
            ((CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId> *)
             (in_RSI + 1));
  pvVar1 = std::array<int,_1UL>::operator[]
                     ((array<int,_1UL> *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
  local_18 = *pvVar1;
  local_1c = FunctionalConstraint::GetResultVar(local_10);
  pFVar2 = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           ::GetMC(in_RDI);
  local_170 = 0x3ff0000000000000;
  local_168 = 0x3ff0000000000000;
  local_160 = &local_170;
  local_158 = 2;
  std::allocator<double>::allocator((allocator<double> *)0x20712c);
  __l._M_len = (size_type)pFVar2;
  __l._M_array = (iterator)in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffc60,__l,(allocator_type *)in_stack_fffffffffffffc58);
  local_1b9._1_4_ = local_1c;
  local_1b9._5_4_ = local_18;
  local_1b9._9_8_ = local_1b9 + 1;
  local_1b9._17_8_ = 2;
  rr.rhs_ = (double)local_1b9;
  std::allocator<int>::allocator((allocator<int> *)0x20719a);
  __l_00._M_len = (size_type)pFVar2;
  __l_00._M_array = (iterator)in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_00,
             (allocator_type *)in_stack_fffffffffffffc58);
  LinTerms::LinTerms((LinTerms *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc98,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90.rhs_);
  AlgConRhs<1>::AlgConRhs(&local_1c8,0.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            (in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,rr,(bool)uVar4);
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)rr.rhs_,in_stack_fffffffffffffc58);
  local_1d8 = NVar3;
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            (in_stack_fffffffffffffc30);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffffc30);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc40);
  std::allocator<int>::~allocator((allocator<int> *)0x207280);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffc40);
  std::allocator<double>::~allocator((allocator<double> *)0x20729a);
  this_00 = BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::GetMC(in_RDI);
  local_328 = 0x3ff0000000000000;
  local_320 = 0xbff0000000000000;
  local_318 = &local_328;
  local_310 = 2;
  uVar4 = (undefined1)((ulong)&local_329 >> 0x38);
  std::allocator<double>::allocator((allocator<double> *)0x2072fb);
  __l_01._M_len = (size_type)pFVar2;
  __l_01._M_array = (iterator)in_RDI;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)rr.rhs_,__l_01,(allocator_type *)NVar3.pvn_)
  ;
  iVar5 = local_1c;
  vVar6 = local_18;
  std::allocator<int>::allocator((allocator<int> *)0x20735d);
  __l_02._M_len = (size_type)pFVar2;
  __l_02._M_array = (iterator)in_RDI;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)rr.rhs_,__l_02,(allocator_type *)NVar3.pvn_);
  LinTerms::LinTerms((LinTerms *)CONCAT44(vVar6,iVar5),in_stack_fffffffffffffc98,
                     (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90.rhs_);
  AlgConRhs<1>::AlgConRhs((AlgConRhs<1> *)&stack0xfffffffffffffc90,0.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar3.pvn_,
             (LinTerms *)NVar3.ir_,rr,(bool)uVar4);
  NVar3 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)rr.rhs_,(AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar3.pvn_);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar3.pvn_);
  LinTerms::~LinTerms((LinTerms *)NVar3.pvn_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::allocator<int>::~allocator((allocator<int> *)0x207432);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)this_00);
  std::allocator<double>::~allocator((allocator<double> *)0x20744c);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& ac, int ) {
    const int arg = ac.GetArguments()[0];
    const int res = ac.GetResultVar();
    GetMC().AddConstraint(LinConGE({{1.0, 1.0}, {res, arg}}, {0.0}));
    GetMC().AddConstraint(LinConGE({{1.0, -1.0}, {res, arg}}, {0.0}));
  }